

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::scan(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *this)

{
  bool bVar1;
  token_type tVar2;
  pointer pvVar3;
  size_type sVar4;
  pointer literal_text;
  array<char,_4UL> local_25;
  undefined1 local_21 [4];
  array<char,_4UL> null_literal;
  array<char,_5UL> false_literal;
  array<char,_4UL> true_literal;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  
  if (((this->position).chars_read_total != 0) || (bVar1 = skip_bom(this), bVar1)) {
    skip_whitespace(this);
    while( true ) {
      bVar1 = false;
      if ((this->ignore_comments & 1U) != 0) {
        bVar1 = this->current == 0x2f;
      }
      if (!bVar1) {
        switch(this->current) {
        default:
          this->error_message = "invalid literal";
          return parse_error;
        case 0x22:
          tVar2 = scan_string(this);
          return tVar2;
        case 0x2c:
          return value_separator;
        case 0x2d:
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
          tVar2 = scan_number(this);
          return tVar2;
        case 0x3a:
          return name_separator;
        case 0x5b:
          return begin_array;
        case 0x5d:
          return end_array;
        case 0x66:
          local_21[0] = 'f';
          local_21[1] = 'a';
          local_21[2] = 'l';
          local_21[3] = 's';
          null_literal._M_elems[0] = 'e';
          literal_text = std::array<char,_5UL>::data((array<char,_5UL> *)local_21);
          sVar4 = std::array<char,_5UL>::size((array<char,_5UL> *)local_21);
          tVar2 = scan_literal(this,literal_text,sVar4,literal_false);
          return tVar2;
        case 0x6e:
          builtin_strncpy(local_25._M_elems,"null",4);
          pvVar3 = std::array<char,_4UL>::data(&local_25);
          sVar4 = std::array<char,_4UL>::size(&local_25);
          tVar2 = scan_literal(this,pvVar3,sVar4,literal_null);
          return tVar2;
        case 0x74:
          stack0xffffffffffffffe4 = 0x65757274;
          pvVar3 = std::array<char,_4UL>::data((array<char,_4UL> *)(null_literal._M_elems + 1));
          sVar4 = std::array<char,_4UL>::size((array<char,_4UL> *)(null_literal._M_elems + 1));
          tVar2 = scan_literal(this,pvVar3,sVar4,literal_true);
          return tVar2;
        case 0x7b:
          return begin_object;
        case 0x7d:
          return end_object;
        case -1:
        case 0:
          return end_of_input;
        }
      }
      bVar1 = scan_comment(this);
      if (!bVar1) break;
      skip_whitespace(this);
    }
  }
  else {
    this->error_message = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
  }
  return parse_error;
}

Assistant:

token_type scan()
    {
        // initially, skip the BOM
        if (position.chars_read_total == 0 && !skip_bom())
        {
            error_message = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
            return token_type::parse_error;
        }

        // read next character and ignore whitespace
        skip_whitespace();

        // ignore comments
        while (ignore_comments && current == '/')
        {
            if (!scan_comment())
            {
                return token_type::parse_error;
            }

            // skip following whitespace
            skip_whitespace();
        }

        switch (current)
        {
            // structural characters
            case '[':
                return token_type::begin_array;
            case ']':
                return token_type::end_array;
            case '{':
                return token_type::begin_object;
            case '}':
                return token_type::end_object;
            case ':':
                return token_type::name_separator;
            case ',':
                return token_type::value_separator;

            // literals
            case 't':
            {
                std::array<char_type, 4> true_literal = {{char_type('t'), char_type('r'), char_type('u'), char_type('e')}};
                return scan_literal(true_literal.data(), true_literal.size(), token_type::literal_true);
            }
            case 'f':
            {
                std::array<char_type, 5> false_literal = {{char_type('f'), char_type('a'), char_type('l'), char_type('s'), char_type('e')}};
                return scan_literal(false_literal.data(), false_literal.size(), token_type::literal_false);
            }
            case 'n':
            {
                std::array<char_type, 4> null_literal = {{char_type('n'), char_type('u'), char_type('l'), char_type('l')}};
                return scan_literal(null_literal.data(), null_literal.size(), token_type::literal_null);
            }

            // string
            case '\"':
                return scan_string();

            // number
            case '-':
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                return scan_number();

            // end of input (the null byte is needed when parsing from
            // string literals)
            case '\0':
            case std::char_traits<char_type>::eof():
                return token_type::end_of_input;

            // error
            default:
                error_message = "invalid literal";
                return token_type::parse_error;
        }
    }